

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_getrealdir(char *args)

{
  size_t sVar1;
  long lVar2;
  char *__s;
  
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar1 = strlen(__s);
    args[sVar1] = '\0';
  }
  lVar2 = PHYSFS_getRealDir(__s);
  if (lVar2 == 0) {
    puts("Not found.");
  }
  else {
    printf("Found at [%s].\n",lVar2);
  }
  return 1;
}

Assistant:

static int cmd_getrealdir(char *args)
{
    const char *rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_getRealDir(args);
    if (rc)
        printf("Found at [%s].\n", rc);
    else
        printf("Not found.\n");

    return 1;
}